

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<float>::CallOut(ChValueSpecific<float> *this,ChArchiveOut *marchive)

{
  float *t;
  char *custom_name;
  ChNameValue<float> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<float> *this_local;
  
  t = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  custom_name = (char *)std::__cxx11::string::c_str();
  make_ChNameValue<float>(&local_30,"*this->_ptr_to_val",t,custom_name,'\0');
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_30);
  ChNameValue<float>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}